

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCtxtReadDoc(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  xmlChar *val_00;
  char *val_01;
  char *val_02;
  xmlDocPtr val_03;
  int local_5c;
  int n_options;
  int options;
  int n_encoding;
  char *encoding;
  int n_URL;
  char *URL;
  int n_cur;
  xmlChar *cur;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (cur._4_4_ = 0; (int)cur._4_4_ < 3; cur._4_4_ = cur._4_4_ + 1) {
    for (URL._4_4_ = 0; (int)URL._4_4_ < 5; URL._4_4_ = URL._4_4_ + 1) {
      for (encoding._4_4_ = 0; (int)encoding._4_4_ < 8; encoding._4_4_ = encoding._4_4_ + 1) {
        for (n_options = 0; n_options < 4; n_options = n_options + 1) {
          for (local_5c = 0; local_5c < 5; local_5c = local_5c + 1) {
            iVar1 = xmlMemBlocks();
            val = gen_xmlParserCtxtPtr(cur._4_4_,0);
            val_00 = gen_const_xmlChar_ptr(URL._4_4_,1);
            val_01 = gen_filepath(encoding._4_4_,2);
            val_02 = gen_const_char_ptr(n_options,3);
            iVar2 = gen_parseroptions(local_5c,4);
            val_03 = (xmlDocPtr)xmlCtxtReadDoc(val,val_00,val_01,val_02,iVar2);
            desret_xmlDocPtr(val_03);
            call_tests = call_tests + 1;
            des_xmlParserCtxtPtr(cur._4_4_,val,0);
            des_const_xmlChar_ptr(URL._4_4_,val_00,1);
            des_filepath(encoding._4_4_,val_01,2);
            des_const_char_ptr(n_options,val_02,3);
            des_parseroptions(local_5c,iVar2,4);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlCtxtReadDoc",(ulong)(uint)(iVar2 - iVar1));
              ret_val._4_4_ = ret_val._4_4_ + 1;
              printf(" %d",(ulong)cur._4_4_);
              printf(" %d",(ulong)URL._4_4_);
              printf(" %d",(ulong)encoding._4_4_);
              printf(" %d",(ulong)(uint)n_options);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlCtxtReadDoc(void) {
    int test_ret = 0;

    int mem_base;
    xmlDocPtr ret_val;
    xmlParserCtxtPtr ctxt; /* an XML parser context */
    int n_ctxt;
    xmlChar * cur; /* a pointer to a zero terminated string */
    int n_cur;
    const char * URL; /* the base URL to use for the document */
    int n_URL;
    char * encoding; /* the document encoding, or NULL */
    int n_encoding;
    int options; /* a combination of xmlParserOption */
    int n_options;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_cur = 0;n_cur < gen_nb_const_xmlChar_ptr;n_cur++) {
    for (n_URL = 0;n_URL < gen_nb_filepath;n_URL++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
    for (n_options = 0;n_options < gen_nb_parseroptions;n_options++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        cur = gen_const_xmlChar_ptr(n_cur, 1);
        URL = gen_filepath(n_URL, 2);
        encoding = gen_const_char_ptr(n_encoding, 3);
        options = gen_parseroptions(n_options, 4);

        ret_val = xmlCtxtReadDoc(ctxt, (const xmlChar *)cur, URL, (const char *)encoding, options);
        desret_xmlDocPtr(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_const_xmlChar_ptr(n_cur, (const xmlChar *)cur, 1);
        des_filepath(n_URL, URL, 2);
        des_const_char_ptr(n_encoding, (const char *)encoding, 3);
        des_parseroptions(n_options, options, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCtxtReadDoc",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_cur);
            printf(" %d", n_URL);
            printf(" %d", n_encoding);
            printf(" %d", n_options);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}